

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t toUpperOrTitle(UChar32 c,UCaseContextIterator *iter,void *context,UChar **pString,
                      int32_t loc,UBool upperNotTitle)

{
  ushort uVar1;
  ushort uVar2;
  sbyte sVar3;
  UBool UVar4;
  uint uVar5;
  undefined2 *puVar6;
  int iVar7;
  long lVar8;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  uint local_58;
  int32_t delta;
  int32_t idx;
  int32_t full;
  uint16_t excWord;
  uint16_t *pe2;
  uint16_t *pe;
  uint16_t props;
  UChar32 result;
  UBool upperNotTitle_local;
  int32_t loc_local;
  UChar **pString_local;
  void *context_local;
  UCaseContextIterator *iter_local;
  UChar32 c_local;
  
  uVar5 = c >> 5;
  if ((uint)c < 0xd800) {
    local_64 = (uint)ucase_props_trieIndex[(int)uVar5] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar7 = 0;
      if (c < 0xdc00) {
        iVar7 = 0x140;
      }
      local_68 = (uint)ucase_props_trieIndex[(int)(iVar7 + uVar5)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_70 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar5 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_70 = 0x2f1c;
        }
        local_6c = local_70;
      }
      else {
        local_6c = 0xd30;
      }
      local_68 = local_6c;
    }
    local_64 = local_68;
  }
  uVar1 = ucase_props_trieIndex[local_64];
  if ((uVar1 & 8) == 0) {
    pe._4_4_ = c;
    if ((uVar1 & 3) == 1) {
      pe._4_4_ = c + ((int)(short)uVar1 >> 7);
    }
  }
  else {
    lVar8 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x255bb2;
    uVar2 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
    if ((uVar2 & 0x4000) == 0) {
      if ((uVar2 & 0x80) != 0) {
        if ((uVar2 & 0x100) == 0) {
          pe2 = (uint16_t *)(lVar8 + (long)(int)(uint)""[(int)(uVar2 & 0x7f)] * 2);
          delta = (int32_t)*pe2;
        }
        else {
          puVar6 = (undefined2 *)(lVar8 + (long)(int)((uint)""[(int)(uVar2 & 0x7f)] << 1) * 2);
          pe2 = puVar6 + 1;
          delta = CONCAT22(*puVar6,*pe2);
        }
        pe2 = pe2 + (long)(int)(delta & 0xf) + (long)(int)(delta >> 4 & 0xf) + 1;
        uVar5 = delta >> 8;
        if (upperNotTitle == '\0') {
          pe2 = pe2 + (int)(uVar5 & 0xf);
          uVar5 = delta >> 0xc;
        }
        delta = uVar5 & 0xf;
        if (delta != 0) {
          *pString = (UChar *)pe2;
          return delta;
        }
      }
    }
    else {
      if ((loc == 2) && (c == 0x69)) {
        return 0x130;
      }
      if (((loc == 3) && (c == 0x307)) &&
         (UVar4 = isPrecededBySoftDotted(iter,context), UVar4 != '\0')) {
        *pString = (UChar *)0x0;
        return 0;
      }
    }
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 3) == 1)) {
      if ((uVar2 & 0x100) == 0) {
        local_58 = (uint)*(ushort *)(lVar8 + (long)(int)(uint)""[(int)(uVar2 & 0xf)] * 2);
      }
      else {
        puVar6 = (undefined2 *)(lVar8 + (long)(int)((uint)""[(int)(uVar2 & 0xf)] << 1) * 2);
        local_58 = CONCAT22(*puVar6,puVar6[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_58 = -local_58;
      }
      local_74 = c + local_58;
      return local_74;
    }
    if ((upperNotTitle == '\0') && ((uVar2 & 8) != 0)) {
      sVar3 = 3;
    }
    else {
      if ((uVar2 & 4) == 0) {
        return c ^ 0xffffffff;
      }
      sVar3 = 2;
    }
    if ((uVar2 & 0x100) == 0) {
      pe._4_4_ = (uint)*(ushort *)
                        (lVar8 + (long)(int)(uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] * 2);
    }
    else {
      puVar6 = (undefined2 *)
               (lVar8 + (long)(int)((uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] << 1) * 2);
      pe._4_4_ = CONCAT22(*puVar6,puVar6[1]);
    }
  }
  if (pe._4_4_ == c) {
    local_78 = pe._4_4_ ^ 0xffffffff;
  }
  else {
    local_78 = pe._4_4_;
  }
  return local_78;
}

Assistant:

static int32_t
toUpperOrTitle(UChar32 c,
               UCaseContextIterator *iter, void *context,
               const UChar **pString,
               int32_t loc,
               UBool upperNotTitle) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full, idx;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_SPECIAL) {
            /* use hardcoded conditions and mappings */
            if(loc==UCASE_LOC_TURKISH && c==0x69) {
                /*
                    # Turkish and Azeri

                    # I and i-dotless; I-dot and i are case pairs in Turkish and Azeri
                    # The following rules handle those cases.

                    # When uppercasing, i turns into a dotted capital I

                    0069; 0069; 0130; 0130; tr; # LATIN SMALL LETTER I
                    0069; 0069; 0130; 0130; az; # LATIN SMALL LETTER I
                */
                return 0x130;
            } else if(loc==UCASE_LOC_LITHUANIAN && c==0x307 && isPrecededBySoftDotted(iter, context)) {
                /*
                    # Lithuanian

                    # Lithuanian retains the dot in a lowercase i when followed by accents.

                    # Remove DOT ABOVE after "i" with upper or titlecase

                    0307; 0307; ; ; lt After_Soft_Dotted; # COMBINING DOT ABOVE
                 */
                *pString=nullptr;
                return 0; /* remove the dot (continue without output) */
            } else {
                /* no known conditional special case mapping, use a normal mapping */
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);

            /* start of full case mapping strings */
            ++pe;

            /* skip the lowercase and case-folding result strings */
            pe+=full&UCASE_FULL_LOWER;
            full>>=4;
            pe+=full&0xf;
            full>>=4;

            if(upperNotTitle) {
                full&=0xf;
            } else {
                /* skip the uppercase result string */
                pe+=full&0xf;
                full=(full>>4)&0xf;
            }

            if(full!=0) {
                /* set the output pointer to the result string */
                *pString=reinterpret_cast<const UChar *>(pe);

                /* return the string length */
                return full;
            }
        }

        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_GET_TYPE(props)==UCASE_LOWER) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(!upperNotTitle && HAS_SLOT(excWord, UCASE_EXC_TITLE)) {
            idx=UCASE_EXC_TITLE;
        } else if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
            /* here, titlecase is same as uppercase */
            idx=UCASE_EXC_UPPER;
        } else {
            return ~c;
        }
        GET_SLOT_VALUE(excWord, idx, pe2, result);
    }

    return (result==c) ? ~result : result;
}